

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

char * testing::internal::GetAnsiColorCode(GTestColor color)

{
  char *pcStack_10;
  GTestColor color_local;
  
  if (color == kRed) {
    pcStack_10 = "1";
  }
  else if (color == kGreen) {
    pcStack_10 = "2";
  }
  else if (color == kYellow) {
    pcStack_10 = "3";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* GetAnsiColorCode(GTestColor color) {
  switch (color) {
    case GTestColor::kRed:
      return "1";
    case GTestColor::kGreen:
      return "2";
    case GTestColor::kYellow:
      return "3";
    default:
      return nullptr;
  }
}